

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O2

Aig_Obj_t * Aig_And(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  bool bVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  
LAB_00576ebe:
  pAVar8 = p1;
  pAVar7 = p0;
  if (pAVar7 == pAVar8) {
    return pAVar7;
  }
  pAVar10 = (Aig_Obj_t *)((ulong)pAVar8 ^ 1);
  if (pAVar7 == pAVar10) {
    return (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  }
  pAVar11 = (Aig_Obj_t *)((ulong)pAVar7 & 0xfffffffffffffffe);
  pAVar1 = p->pConst1;
  if (pAVar1 == pAVar11) {
    if (pAVar7 == pAVar11) {
      return pAVar8;
    }
    return (Aig_Obj_t *)((ulong)pAVar7 | 1);
  }
  pAVar12 = (Aig_Obj_t *)((ulong)pAVar8 & 0xfffffffffffffffe);
  if (pAVar1 == pAVar12) {
    if (pAVar1 == pAVar8) {
      return pAVar7;
    }
LAB_00577234:
    return (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
  }
  if ((p->fAddStrash == 0) ||
     (((*(uint *)&pAVar11->field_0x18 & 7) - 7 < 0xfffffffe &&
      ((*(uint *)&pAVar12->field_0x18 & 7) - 7 < 0xfffffffe)))) goto LAB_00577171;
  pAVar2 = pAVar11->pFanin0;
  pAVar3 = pAVar11->pFanin1;
  pAVar4 = pAVar12->pFanin0;
  pAVar5 = pAVar12->pFanin1;
  if (((ulong)pAVar7 & 1) == 0) {
    if (pAVar3 == pAVar10 || pAVar2 == pAVar10) goto LAB_00577234;
    if (pAVar2 == pAVar8) {
      return pAVar7;
    }
    if (pAVar3 == pAVar8) {
      return pAVar7;
    }
  }
  else {
    if (pAVar3 == pAVar10 || pAVar2 == pAVar10) {
      return pAVar8;
    }
    if (pAVar3 == pAVar8) {
      p0 = (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
      p1 = pAVar3;
      goto LAB_00576ebe;
    }
    if (pAVar2 == pAVar8) {
      p0 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
      p1 = pAVar2;
      goto LAB_00576ebe;
    }
  }
  bVar6 = pAVar5 == (Aig_Obj_t *)((ulong)pAVar7 ^ 1) || pAVar4 == (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
  p1 = pAVar5;
  if (((ulong)pAVar8 & 1) == 0) {
    if (bVar6) goto LAB_00577234;
    if (pAVar4 == pAVar7) {
      return pAVar8;
    }
    if (pAVar5 == pAVar7) {
      return pAVar8;
    }
    pAVar10 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
    if (((ulong)pAVar7 & 1) == 0) {
      if ((((pAVar2 == pAVar10) || (pAVar2 == (Aig_Obj_t *)((ulong)pAVar5 ^ 1))) ||
          (pAVar3 == pAVar10)) || (pAVar3 == (Aig_Obj_t *)((ulong)pAVar5 ^ 1))) goto LAB_00577234;
      p0 = pAVar7;
      if (((pAVar2 != pAVar4) && (pAVar3 != pAVar4)) &&
         ((p0 = pAVar2, p1 = pAVar8, pAVar3 != pAVar5 &&
          (p0 = pAVar7, p1 = pAVar4, pAVar2 != pAVar5)))) {
LAB_00577171:
        uVar9 = (uint)pAVar7 & 1;
LAB_00577176:
        if ((((uVar9 & (uint)pAVar8) != 0) && (p->fCatchExor != 0)) &&
           (((*(uint *)&pAVar11->field_0x18 & 7) == 5 && ((*(uint *)&pAVar12->field_0x18 & 7) == 5))
           )) {
          pAVar10 = pAVar11->pFanin0;
          if (((ulong)pAVar12->pFanin0 ^ (ulong)pAVar10) < 2) {
            pAVar1 = pAVar11->pFanin1;
            if (((pAVar12->pFanin1 != pAVar1) && (pAVar12->pFanin0 != pAVar10)) &&
               (((ulong)pAVar12->pFanin1 ^ (ulong)pAVar1) < 2)) {
              pAVar7 = Aig_Exor(p,pAVar10,pAVar1);
              return pAVar7;
            }
          }
        }
        pAVar7 = Aig_ObjCreateGhost(p,pAVar7,pAVar8,AIG_OBJ_AND);
        pAVar8 = Aig_TableLookup(p,pAVar7);
        if (pAVar8 != (Aig_Obj_t *)0x0) {
          return pAVar8;
        }
        pAVar7 = Aig_ObjCreate(p,pAVar7);
        return pAVar7;
      }
    }
    else {
      if (pAVar2 == pAVar10) {
        return pAVar8;
      }
      if (pAVar2 == (Aig_Obj_t *)((ulong)pAVar5 ^ 1)) {
        return pAVar8;
      }
      if (pAVar3 == pAVar10) {
        return pAVar8;
      }
      if (pAVar3 == (Aig_Obj_t *)((ulong)pAVar5 ^ 1)) {
        return pAVar8;
      }
      if ((pAVar3 == pAVar4) || (pAVar3 == pAVar5)) {
        p0 = (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
        p1 = pAVar8;
      }
      else {
        if ((pAVar2 != pAVar4) && (pAVar2 != pAVar5)) goto LAB_00577171;
        p0 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
        p1 = pAVar8;
      }
    }
  }
  else {
    if (bVar6) {
      return pAVar7;
    }
    if (pAVar5 == pAVar7) {
      p0 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
    }
    else if (pAVar4 == pAVar7) {
      p0 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      p1 = pAVar4;
    }
    else {
      if (((ulong)pAVar7 & 1) != 0) {
        if ((pAVar2 == pAVar5) && (pAVar3 == (Aig_Obj_t *)((ulong)pAVar4 ^ 1))) {
LAB_00577257:
          return (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
        }
        if ((pAVar3 != pAVar4) || (pAVar2 != (Aig_Obj_t *)((ulong)pAVar5 ^ 1))) {
          if ((pAVar2 == pAVar4) && (pAVar3 == (Aig_Obj_t *)((ulong)pAVar5 ^ 1))) goto LAB_00577257;
          uVar9 = 1;
          if ((pAVar3 != pAVar5) || (pAVar2 != (Aig_Obj_t *)((ulong)pAVar4 ^ 1))) goto LAB_00577176;
        }
        return (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
      }
      if (pAVar4 == (Aig_Obj_t *)((ulong)pAVar2 ^ 1)) {
        return pAVar7;
      }
      if (pAVar4 == (Aig_Obj_t *)((ulong)pAVar3 ^ 1)) {
        return pAVar7;
      }
      if (pAVar5 == (Aig_Obj_t *)((ulong)pAVar2 ^ 1)) {
        return pAVar7;
      }
      if (pAVar5 == (Aig_Obj_t *)((ulong)pAVar3 ^ 1)) {
        return pAVar7;
      }
      p1 = pAVar7;
      if ((pAVar5 == pAVar2) || (pAVar5 == pAVar3)) {
        p0 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
      }
      else {
        if ((pAVar4 != pAVar2) && (pAVar4 != pAVar3)) goto LAB_00577171;
        p0 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      }
    }
  }
  goto LAB_00576ebe;
}

Assistant:

Aig_Obj_t * Aig_And( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    Aig_Obj_t * pGhost, * pResult;
    Aig_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_Not(p1) )
        return Aig_Not(p->pConst1);
    if ( Aig_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Aig_Not(p->pConst1);
    if ( Aig_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Aig_Not(p->pConst1);
    // check not so trivial cases
    if ( p->fAddStrash && (Aig_ObjIsNode(Aig_Regular(p0)) || Aig_ObjIsNode(Aig_Regular(p1))) )
    { // http://fmv.jku.at/papers/BrummayerBiere-MEMICS06.pdf
        Aig_Obj_t * pFanA, * pFanB, * pFanC, * pFanD;
        pFanA = Aig_ObjChild0(Aig_Regular(p0));
        pFanB = Aig_ObjChild1(Aig_Regular(p0));
        pFanC = Aig_ObjChild0(Aig_Regular(p1));
        pFanD = Aig_ObjChild1(Aig_Regular(p1));
        if ( Aig_IsComplement(p0) )
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return p1;
            if ( pFanB == p1 )
                return Aig_And( p, Aig_Not(pFanA), pFanB );
            if ( pFanA == p1 )
                return Aig_And( p, Aig_Not(pFanB), pFanA );
        }
        else
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return Aig_Not(p->pConst1);
            if ( pFanA == p1 || pFanB == p1 )
                return p0;
        }
        if ( Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return p0;
            if ( pFanD == p0 )
                return Aig_And( p, Aig_Not(pFanC), pFanD );
            if ( pFanC == p0 )
                return Aig_And( p, Aig_Not(pFanD), pFanC );
        }
        else
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return Aig_Not(p->pConst1);
            if ( pFanC == p0 || pFanD == p0 )
                return p1;
        }
        if ( !Aig_IsComplement(p0) && !Aig_IsComplement(p1) ) 
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return Aig_Not(p->pConst1);
            if ( pFanA == pFanC || pFanB == pFanC )
                return Aig_And( p, p0, pFanD );
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, pFanA, p1 );
            if ( pFanA == pFanD || pFanB == pFanD )
                return Aig_And( p, p0, pFanC );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, pFanB, p1 );
        }
        else if ( Aig_IsComplement(p0) && !Aig_IsComplement(p1) )
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return p1;
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, Aig_Not(pFanA), p1 );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, Aig_Not(pFanB), p1 );
        }
        else if ( !Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(pFanA) || pFanC == Aig_Not(pFanB) || pFanD == Aig_Not(pFanA) || pFanD == Aig_Not(pFanB) )
                return p0;
            if ( pFanD == pFanA || pFanD == pFanB )
                return Aig_And( p, Aig_Not(pFanC), p0 );
            if ( pFanC == pFanA || pFanC == pFanB )
                return Aig_And( p, Aig_Not(pFanD), p0 );
        }
        else // if ( Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanA == pFanD && pFanB == Aig_Not(pFanC) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanC && pFanA == Aig_Not(pFanD) )
                return Aig_Not(pFanB);
            if ( pFanA == pFanC && pFanB == Aig_Not(pFanD) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanD && pFanA == Aig_Not(pFanC) )
                return Aig_Not(pFanB);
        }
    }
    // check if it can be an EXOR gate
    if ( p->fCatchExor && Aig_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
        return Aig_Exor( p, pFan0, pFan1 );
    pGhost = Aig_ObjCreateGhost( p, p0, p1, AIG_OBJ_AND );
    if ( (pResult = Aig_TableLookup( p, pGhost )) )
        return pResult;
    return Aig_ObjCreate( p, pGhost );
}